

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacon2.c
# Opt level: O1

int slacon2_(int *n,float *v,float *x,int *isgn,float *est,int *kase,int *isave)

{
  float fVar1;
  int iVar2;
  double dVar3;
  integer iVar4;
  ulong uVar5;
  long lVar6;
  real rVar7;
  undefined4 uVar8;
  uint uVar9;
  float fVar10;
  integer local_4c;
  float local_48;
  
  local_4c = 1;
  if (*kase == 0) {
    iVar2 = *n;
    if (0 < (long)iVar2) {
      lVar6 = 0;
      do {
        x[lVar6] = 1.0 / (float)iVar2;
        lVar6 = lVar6 + 1;
      } while (iVar2 != lVar6);
    }
    *kase = 1;
    *isave = 1;
    return 0;
  }
  switch(*isave) {
  case 2:
    iVar4 = isamax_(n,x,&local_4c);
    isave[1] = iVar4 + -1;
    isave[2] = 2;
    goto LAB_001178a8;
  case 3:
    scopy_(n,x,&local_4c,v,&local_4c);
    local_48 = *est;
    rVar7 = sasum_(n,v,&local_4c);
    *est = rVar7;
    if (0 < (long)*n) {
      lVar6 = 0;
      do {
        if ((*(double *)(&DAT_0011b580 + (ulong)(x[lVar6] < 0.0) * 8) != (double)isgn[lVar6]) ||
           (NAN(*(double *)(&DAT_0011b580 + (ulong)(x[lVar6] < 0.0) * 8)) ||
            NAN((double)isgn[lVar6]))) {
          if (local_48 < rVar7) {
            if (0 < *n) {
              lVar6 = 0;
              do {
                fVar10 = x[lVar6];
                fVar1 = *(float *)(&DAT_0011b590 + (ulong)(fVar10 < 0.0) * 4);
                x[lVar6] = fVar1;
                dVar3 = (double)fVar1;
                if (fVar10 < 0.0) {
                  dVar3 = floor(0.5 - dVar3);
                  uVar9 = (uint)((ulong)dVar3 >> 0x20) ^ 0x80000000;
                  uVar8 = SUB84(dVar3,0);
                }
                else {
                  dVar3 = floor(dVar3 + 0.5);
                  uVar8 = SUB84(dVar3,0);
                  uVar9 = (uint)((ulong)dVar3 >> 0x20);
                }
                isgn[lVar6] = (int)(double)CONCAT44(uVar9,uVar8);
                lVar6 = lVar6 + 1;
              } while (lVar6 < *n);
            }
            *kase = 2;
            *isave = 4;
            return 0;
          }
          break;
        }
        lVar6 = lVar6 + 1;
      } while (*n != lVar6);
    }
LAB_00117b16:
    uVar9 = *n;
    if (0 < (int)uVar9) {
      fVar10 = 1.0;
      uVar5 = 0;
      do {
        x[uVar5] = ((float)(int)uVar5 / (float)(int)(uVar9 - 1) + 1.0) * fVar10;
        fVar10 = -fVar10;
        uVar5 = uVar5 + 1;
      } while (uVar9 != uVar5);
    }
    *kase = 1;
    *isave = 5;
    return 0;
  case 4:
    iVar2 = isave[1];
    iVar4 = isamax_(n,x,&local_4c);
    isave[1] = iVar4 + -1;
    if (((x[iVar2] == ABS(x[(long)iVar4 + -1])) &&
        (!NAN(x[iVar2]) && !NAN(ABS(x[(long)iVar4 + -1])))) || (4 < isave[2])) goto LAB_00117b16;
    isave[2] = isave[2] + 1;
LAB_001178a8:
    if (0 < (long)*n) {
      memset(x,0,(long)*n << 2);
    }
    x[isave[1]] = 1.0;
    *kase = 1;
    *isave = 3;
    return 0;
  case 5:
    rVar7 = sasum_(n,x,&local_4c);
    local_48 = rVar7 / (float)(*n * 3);
    local_48 = local_48 + local_48;
    if (local_48 < *est || local_48 == *est) goto LAB_001179da;
    scopy_(n,x,&local_4c,v,&local_4c);
    break;
  default:
    if (*n != 1) {
      rVar7 = sasum_(n,x,&local_4c);
      *est = rVar7;
      if (0 < *n) {
        lVar6 = 0;
        do {
          fVar10 = x[lVar6];
          fVar1 = *(float *)(&DAT_0011b590 + (ulong)(fVar10 < 0.0) * 4);
          x[lVar6] = fVar1;
          dVar3 = (double)fVar1;
          if (fVar10 < 0.0) {
            dVar3 = floor(0.5 - dVar3);
            uVar9 = (uint)((ulong)dVar3 >> 0x20) ^ 0x80000000;
            uVar8 = SUB84(dVar3,0);
          }
          else {
            dVar3 = floor(dVar3 + 0.5);
            uVar8 = SUB84(dVar3,0);
            uVar9 = (uint)((ulong)dVar3 >> 0x20);
          }
          isgn[lVar6] = (int)(double)CONCAT44(uVar9,uVar8);
          lVar6 = lVar6 + 1;
        } while (lVar6 < *n);
      }
      *kase = 2;
      *isave = 2;
      return 0;
    }
    local_48 = *x;
    *v = local_48;
    local_48 = ABS(local_48);
  }
  *est = local_48;
LAB_001179da:
  *kase = 0;
  return 0;
}

Assistant:

int
slacon2_(int *n, float *v, float *x, int *isgn, float *est, int *kase, int isave[3])
{
    /* Table of constant values */
    int c__1 = 1;
    float      zero = 0.0;
    float      one = 1.0;
    
    /* Local variables */
    int jlast;
    float altsgn, estold;
    int i;
    float temp;
#ifdef _CRAY
    extern int ISAMAX(int *, float *, int *);
    extern float SASUM(int *, float *, int *);
    extern int SCOPY(int *, float *, int *, float *, int *);
#else
    extern int isamax_(int *, float *, int *);
    extern float sasum_(int *, float *, int *);
    extern void scopy_(int *, float *, int *, float *, int *);
#endif
#define d_sign(a, b) (b >= 0 ? fabs(a) : -fabs(a))    /* Copy sign */
#define i_dnnt(a) \
	( a>=0 ? floor(a+.5) : -floor(.5-a) ) /* Round to nearest integer */

    if ( *kase == 0 ) {
	for (i = 0; i < *n; ++i) {
	    x[i] = 1. / (float) (*n);
	}
	*kase = 1;
	isave[0] = 1;	/* jump = 1; */
	return 0;
    }

    switch (isave[0]) {
	case 1:  goto L20;
	case 2:  goto L40;
	case 3:  goto L70;
	case 4:  goto L110;
	case 5:  goto L140;
    }

    /*     ................ ENTRY   (isave[0] == 1)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY A*X. */
  L20:
    if (*n == 1) {
	v[0] = x[0];
	*est = fabs(v[0]);
	/*        ... QUIT */
	goto L150;
    }
#ifdef _CRAY
    *est = SASUM(n, x, &c__1);
#else
    *est = sasum_(n, x, &c__1);
#endif

    for (i = 0; i < *n; ++i) {
	x[i] = d_sign(one, x[i]);
	isgn[i] = i_dnnt(x[i]);
    }
    *kase = 2;
    isave[0] = 2;  /* jump = 2; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 2)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L40:
#ifdef _CRAY
    isave[1] = ISAMAX(n, &x[0], &c__1);  /* j */
#else
    isave[1] = isamax_(n, &x[0], &c__1);  /* j */
#endif
    --isave[1];  /* --j; */
    isave[2] = 2; /* iter = 2; */

    /*     MAIN LOOP - ITERATIONS 2,3,...,ITMAX. */
L50:
    for (i = 0; i < *n; ++i) x[i] = zero;
    x[isave[1]] = one;
    *kase = 1;
    isave[0] = 3;  /* jump = 3; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 3)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L70:
#ifdef _CRAY
    SCOPY(n, x, &c__1, v, &c__1);
#else
    scopy_(n, x, &c__1, v, &c__1);
#endif
    estold = *est;
#ifdef _CRAY
    *est = SASUM(n, v, &c__1);
#else
    *est = sasum_(n, v, &c__1);
#endif

    for (i = 0; i < *n; ++i)
	if (i_dnnt(d_sign(one, x[i])) != isgn[i])
	    goto L90;

    /*     REPEATED SIGN VECTOR DETECTED, HENCE ALGORITHM HAS CONVERGED. */
    goto L120;

L90:
    /*     TEST FOR CYCLING. */
    if (*est <= estold) goto L120;

    for (i = 0; i < *n; ++i) {
	x[i] = d_sign(one, x[i]);
	isgn[i] = i_dnnt(x[i]);
    }
    *kase = 2;
    isave[0] = 4;  /* jump = 4; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 4)
	   X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L110:
    jlast = isave[1];  /* j; */
#ifdef _CRAY
    isave[1] = ISAMAX(n, &x[0], &c__1);/* j */
#else
    isave[1] = isamax_(n, &x[0], &c__1);  /* j */
#endif
    isave[1] = isave[1] - 1;  /* --j; */
    if (x[jlast] != fabs(x[isave[1]]) && isave[2] < 5) {
	isave[2] = isave[2] + 1;  /* ++iter; */
	goto L50;
    }

    /*     ITERATION COMPLETE.  FINAL STAGE. */
L120:
    altsgn = 1.;
    for (i = 1; i <= *n; ++i) {
	x[i-1] = altsgn * ((float)(i - 1) / (float)(*n - 1) + 1.);
	altsgn = -altsgn;
    }
    *kase = 1;
    isave[0] = 5;  /* jump = 5; */
    return 0;
    
    /*     ................ ENTRY   (isave[0] = 5)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L140:
#ifdef _CRAY
    temp = SASUM(n, x, &c__1) / (float)(*n * 3) * 2.;
#else
    temp = sasum_(n, x, &c__1) / (float)(*n * 3) * 2.;
#endif
    if (temp > *est) {
#ifdef _CRAY
	SCOPY(n, &x[0], &c__1, &v[0], &c__1);
#else
	scopy_(n, &x[0], &c__1, &v[0], &c__1);
#endif
	*est = temp;
    }

L150:
    *kase = 0;
    return 0;

}